

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_sse4.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_2d_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  int16_t *piVar1;
  undefined2 *puVar2;
  uint16_t *puVar3;
  undefined2 *puVar4;
  undefined2 *puVar5;
  undefined2 *puVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  byte bVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  undefined1 *puVar40;
  long lVar41;
  ulong uVar42;
  CONV_BUF_TYPE *pCVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar49;
  int iVar50;
  short sVar63;
  int iVar64;
  int iVar66;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar67;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar62;
  short sVar65;
  undefined1 auVar61 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar83;
  short sVar84;
  int iVar85;
  short sVar86;
  short sVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar88;
  undefined1 auVar82 [16];
  short sVar89;
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  uint local_8ba8;
  short local_8b58;
  short sStack_8b56;
  undefined1 local_8b38 [1792];
  undefined1 local_8438 [33800];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  
  cVar22 = (char)bd + '\x0e';
  uVar8 = conv_params->round_1;
  iVar39 = uVar8 + conv_params->round_0;
  bVar32 = cVar22 - (char)iVar39;
  iVar35 = (1 << (bVar32 - 1 & 0x1f)) + (1 << (bVar32 & 0x1f));
  uVar31 = 0xe - iVar39;
  uVar7 = filter_params_y->taps;
  uVar33 = 0xff;
  if (bd == 0xc) {
    uVar33 = 0xfff;
  }
  uVar36 = 0x3ff;
  if (bd != 10) {
    uVar36 = uVar33;
  }
  bVar32 = (byte)conv_params->round_0;
  piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
  uVar23 = *(undefined4 *)piVar1;
  uVar24 = *(undefined4 *)(piVar1 + 2);
  uVar25 = *(undefined4 *)(piVar1 + 4);
  uVar26 = *(undefined4 *)(piVar1 + 6);
  iVar39 = (1 << ((char)bd + 6U & 0x1f)) + ((1 << (bVar32 & 0x1f)) >> 1);
  local_8ba8 = (uint)uVar7;
  uVar33 = (h + (uint)uVar7) - 1;
  uVar42 = 0;
  uVar34 = (ulong)uVar33;
  if ((int)uVar33 < 1) {
    uVar34 = uVar42;
  }
  iVar9 = conv_params->fwd_offset;
  iVar37 = conv_params->bck_offset;
  auVar45 = ZEXT416((uint)conv_params->round_0);
  pCVar43 = conv_params->dst;
  iVar10 = conv_params->dst_stride;
  iVar11 = conv_params->do_average;
  iVar12 = conv_params->use_dist_wtd_comp_avg;
  auVar44._4_4_ = uVar24;
  auVar44._0_4_ = uVar24;
  auVar44._8_4_ = uVar24;
  auVar44._12_4_ = uVar24;
  auVar48._4_4_ = uVar25;
  auVar48._0_4_ = uVar25;
  auVar48._8_4_ = uVar25;
  auVar48._12_4_ = uVar25;
  auVar46._4_4_ = uVar26;
  auVar46._0_4_ = uVar26;
  auVar46._8_4_ = uVar26;
  auVar46._12_4_ = uVar26;
  lVar38 = (long)src +
           (0x12 - ((ulong)(filter_params_x->taps & 0xfffffffe) +
                   (long)(int)(((uVar7 >> 1) - 1) * src_stride) * 2));
  puVar40 = local_8b38;
  for (; uVar42 != uVar34; uVar42 = uVar42 + 1) {
    for (lVar41 = 0; lVar41 < w; lVar41 = lVar41 + 8) {
      auVar47 = *(undefined1 (*) [16])(lVar38 + -0x10 + lVar41 * 2);
      auVar51 = *(undefined1 (*) [16])(lVar38 + lVar41 * 2);
      auVar13._16_16_ = auVar51;
      auVar13._0_16_ = auVar47;
      auVar14._16_16_ = auVar51;
      auVar14._0_16_ = auVar47;
      auVar73 = pmaddwd(auVar14._8_16_,auVar48);
      auVar15._16_16_ = auVar51;
      auVar15._0_16_ = auVar47;
      auVar79 = pmaddwd(auVar15._12_16_,auVar46);
      auVar16._16_16_ = auVar51;
      auVar16._0_16_ = auVar47;
      auVar17._16_16_ = auVar51;
      auVar17._0_16_ = auVar47;
      auVar18._16_16_ = auVar51;
      auVar18._0_16_ = auVar47;
      auVar19._16_16_ = auVar51;
      auVar19._0_16_ = auVar47;
      auVar20._4_4_ = uVar23;
      auVar20._0_4_ = uVar23;
      auVar20._8_4_ = uVar23;
      auVar20._12_4_ = uVar23;
      auVar51 = pmaddwd(auVar47,auVar20);
      auVar47 = pmaddwd(auVar13._4_16_,auVar44);
      auVar52._0_4_ =
           auVar51._0_4_ + iVar39 + auVar47._0_4_ + auVar79._0_4_ + auVar73._0_4_ >> auVar45;
      auVar52._4_4_ =
           auVar51._4_4_ + iVar39 + auVar47._4_4_ + auVar79._4_4_ + auVar73._4_4_ >> auVar45;
      auVar52._8_4_ =
           auVar51._8_4_ + iVar39 + auVar47._8_4_ + auVar79._8_4_ + auVar73._8_4_ >> auVar45;
      auVar52._12_4_ =
           auVar51._12_4_ + iVar39 + auVar47._12_4_ + auVar79._12_4_ + auVar73._12_4_ >> auVar45;
      auVar21._4_4_ = uVar23;
      auVar21._0_4_ = uVar23;
      auVar21._8_4_ = uVar23;
      auVar21._12_4_ = uVar23;
      auVar73 = pmaddwd(auVar16._2_16_,auVar21);
      auVar79 = pmaddwd(auVar17._6_16_,auVar44);
      auVar47 = pmaddwd(auVar18._10_16_,auVar48);
      auVar51 = pmaddwd(auVar19._14_16_,auVar46);
      auVar74._0_4_ =
           auVar73._0_4_ + iVar39 + auVar47._0_4_ + auVar79._0_4_ + auVar51._0_4_ >> auVar45;
      auVar74._4_4_ =
           auVar73._4_4_ + iVar39 + auVar47._4_4_ + auVar79._4_4_ + auVar51._4_4_ >> auVar45;
      auVar74._8_4_ =
           auVar73._8_4_ + iVar39 + auVar47._8_4_ + auVar79._8_4_ + auVar51._8_4_ >> auVar45;
      auVar74._12_4_ =
           auVar73._12_4_ + iVar39 + auVar47._12_4_ + auVar79._12_4_ + auVar51._12_4_ >> auVar45;
      auVar47 = packssdw(auVar52,auVar74);
      *(undefined1 (*) [16])(puVar40 + lVar41 * 2) = auVar47;
    }
    lVar38 = lVar38 + (long)src_stride * 2;
    puVar40 = puVar40 + 0x100;
  }
  auVar45._4_4_ = iVar37;
  auVar45._0_4_ = iVar37;
  auVar45._8_4_ = iVar37;
  auVar45._12_4_ = iVar37;
  auVar44 = pshuflw(auVar45,ZEXT416(uVar36),0);
  piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * local_8ba8;
  uVar23 = *(undefined4 *)piVar1;
  uVar24 = *(undefined4 *)(piVar1 + 2);
  uVar25 = *(undefined4 *)(piVar1 + 4);
  uVar26 = *(undefined4 *)(piVar1 + 6);
  iVar37 = (-1 << (cVar22 + ~bVar32 & 0x1f)) + ((1 << ((byte)uVar8 & 0x1f)) >> 1);
  auVar48 = ZEXT416(uVar8);
  iVar39 = ((1 << ((byte)uVar31 & 0x1f)) >> 1) - iVar35;
  uVar34 = 0;
  uVar42 = (ulong)(uint)h;
  if (h < 1) {
    uVar42 = 0;
  }
  puVar40 = local_8438;
  auVar51._4_4_ = uVar23;
  auVar51._0_4_ = uVar23;
  auVar51._8_4_ = uVar23;
  auVar51._12_4_ = uVar23;
  auVar47._4_4_ = uVar24;
  auVar47._0_4_ = uVar24;
  auVar47._8_4_ = uVar24;
  auVar47._12_4_ = uVar24;
  for (; uVar34 != uVar42; uVar34 = uVar34 + 1) {
    for (lVar38 = 0; lVar38 < w; lVar38 = lVar38 + 8) {
      auVar46 = *(undefined1 (*) [16])(puVar40 + lVar38 * 2 + -0x700);
      puVar4 = (undefined2 *)(puVar40 + lVar38 * 2 + -0x600);
      auVar73 = *(undefined1 (*) [16])(puVar40 + lVar38 * 2 + -0x500);
      auVar76._0_12_ = auVar46._0_12_;
      auVar76._12_2_ = auVar46._6_2_;
      auVar76._14_2_ = puVar4[3];
      auVar57._12_4_ = auVar76._12_4_;
      auVar57._0_10_ = auVar46._0_10_;
      auVar57._10_2_ = puVar4[2];
      auVar79._10_6_ = auVar57._10_6_;
      auVar79._0_8_ = auVar46._0_8_;
      auVar79._8_2_ = auVar46._4_2_;
      auVar72._8_8_ = auVar79._8_8_;
      auVar72._6_2_ = puVar4[1];
      auVar72._4_2_ = auVar46._2_2_;
      auVar72._0_2_ = auVar46._0_2_;
      auVar72._2_2_ = *puVar4;
      puVar5 = (undefined2 *)(puVar40 + lVar38 * 2 + -0x400);
      auVar71._0_12_ = auVar73._0_12_;
      auVar71._12_2_ = auVar73._6_2_;
      auVar71._14_2_ = puVar5[3];
      auVar70._12_4_ = auVar71._12_4_;
      auVar70._0_10_ = auVar73._0_10_;
      auVar70._10_2_ = puVar5[2];
      auVar69._10_6_ = auVar70._10_6_;
      auVar69._0_8_ = auVar73._0_8_;
      auVar69._8_2_ = auVar73._4_2_;
      auVar68._8_8_ = auVar69._8_8_;
      auVar68._6_2_ = puVar5[1];
      auVar68._4_2_ = auVar73._2_2_;
      auVar68._0_2_ = auVar73._0_2_;
      auVar68._2_2_ = *puVar5;
      auVar79 = *(undefined1 (*) [16])(puVar40 + lVar38 * 2 + -0x300);
      puVar6 = (undefined2 *)(puVar40 + lVar38 * 2 + -0x200);
      auVar93._0_12_ = auVar79._0_12_;
      auVar93._12_2_ = auVar79._6_2_;
      auVar93._14_2_ = puVar6[3];
      auVar92._12_4_ = auVar93._12_4_;
      auVar92._0_10_ = auVar79._0_10_;
      auVar92._10_2_ = puVar6[2];
      auVar91._10_6_ = auVar92._10_6_;
      auVar91._0_8_ = auVar79._0_8_;
      auVar91._8_2_ = auVar79._4_2_;
      auVar90._8_8_ = auVar91._8_8_;
      auVar90._6_2_ = puVar6[1];
      auVar90._4_2_ = auVar79._2_2_;
      auVar90._0_2_ = auVar79._0_2_;
      auVar90._2_2_ = *puVar6;
      auVar76 = *(undefined1 (*) [16])(puVar40 + lVar38 * 2 + -0x100);
      puVar2 = (undefined2 *)(puVar40 + lVar38 * 2);
      auVar53 = pmaddwd(auVar72,auVar51);
      auVar72 = pmaddwd(auVar68,auVar47);
      auVar56._0_12_ = auVar76._0_12_;
      auVar56._12_2_ = auVar76._6_2_;
      auVar56._14_2_ = puVar2[3];
      auVar94._12_4_ = auVar56._12_4_;
      auVar94._0_10_ = auVar76._0_10_;
      auVar94._10_2_ = puVar2[2];
      auVar55._10_6_ = auVar94._10_6_;
      auVar55._0_8_ = auVar76._0_8_;
      auVar55._8_2_ = auVar76._4_2_;
      auVar54._8_8_ = auVar55._8_8_;
      auVar54._6_2_ = puVar2[1];
      auVar54._4_2_ = auVar76._2_2_;
      auVar54._0_2_ = auVar76._0_2_;
      auVar54._2_2_ = *puVar2;
      auVar28._4_4_ = uVar25;
      auVar28._0_4_ = uVar25;
      auVar28._8_4_ = uVar25;
      auVar28._12_4_ = uVar25;
      auVar94 = pmaddwd(auVar90,auVar28);
      auVar27._4_4_ = uVar26;
      auVar27._0_4_ = uVar26;
      auVar27._8_4_ = uVar26;
      auVar27._12_4_ = uVar26;
      auVar57 = pmaddwd(auVar54,auVar27);
      auVar58._0_4_ = auVar57._0_4_ + auVar94._0_4_ + auVar72._0_4_ + auVar53._0_4_;
      auVar58._4_4_ = auVar57._4_4_ + auVar94._4_4_ + auVar72._4_4_ + auVar53._4_4_;
      auVar58._8_4_ = auVar57._8_4_ + auVar94._8_4_ + auVar72._8_4_ + auVar53._8_4_;
      auVar58._12_4_ = auVar57._12_4_ + auVar94._12_4_ + auVar72._12_4_ + auVar53._12_4_;
      auVar75._2_2_ = puVar4[4];
      auVar75._0_2_ = auVar46._8_2_;
      auVar75._4_2_ = auVar46._10_2_;
      auVar75._6_2_ = puVar4[5];
      auVar75._8_2_ = auVar46._12_2_;
      auVar75._10_2_ = puVar4[6];
      auVar75._12_2_ = auVar46._14_2_;
      auVar75._14_2_ = puVar4[7];
      auVar53._2_2_ = puVar5[4];
      auVar53._0_2_ = auVar73._8_2_;
      auVar53._4_2_ = auVar73._10_2_;
      auVar53._6_2_ = puVar5[5];
      auVar53._8_2_ = auVar73._12_2_;
      auVar53._10_2_ = puVar5[6];
      auVar53._12_2_ = auVar73._14_2_;
      auVar53._14_2_ = puVar5[7];
      auVar73._2_2_ = puVar6[4];
      auVar73._0_2_ = auVar79._8_2_;
      auVar73._4_2_ = auVar79._10_2_;
      auVar73._6_2_ = puVar6[5];
      auVar73._8_2_ = auVar79._12_2_;
      auVar73._10_2_ = puVar6[6];
      auVar73._12_2_ = auVar79._14_2_;
      auVar73._14_2_ = puVar6[7];
      auVar80._2_2_ = puVar2[4];
      auVar80._0_2_ = auVar76._8_2_;
      auVar80._4_2_ = auVar76._10_2_;
      auVar80._6_2_ = puVar2[5];
      auVar80._8_2_ = auVar76._12_2_;
      auVar80._10_2_ = puVar2[6];
      auVar80._12_2_ = auVar76._14_2_;
      auVar80._14_2_ = puVar2[7];
      auVar76 = pmaddwd(auVar75,auVar51);
      auVar79 = pmaddwd(auVar53,auVar47);
      auVar46 = pmaddwd(auVar73,auVar28);
      auVar73 = pmaddwd(auVar80,auVar27);
      auVar81._0_4_ = auVar73._0_4_ + auVar46._0_4_ + auVar79._0_4_ + auVar76._0_4_;
      auVar81._4_4_ = auVar73._4_4_ + auVar46._4_4_ + auVar79._4_4_ + auVar76._4_4_;
      auVar81._8_4_ = auVar73._8_4_ + auVar46._8_4_ + auVar79._8_4_ + auVar76._8_4_;
      auVar81._12_4_ = auVar73._12_4_ + auVar46._12_4_ + auVar79._12_4_ + auVar76._12_4_;
      auVar77._0_4_ = (auVar58._0_4_ + iVar37 >> auVar48) + iVar35;
      auVar77._4_4_ = (auVar81._0_4_ + iVar37 >> auVar48) + iVar35;
      auVar77._8_4_ = (auVar58._4_4_ + iVar37 >> auVar48) + iVar35;
      auVar77._12_4_ = (auVar81._4_4_ + iVar37 >> auVar48) + iVar35;
      auVar73 = pmulld(auVar77,auVar45);
      auVar46 = ZEXT416(uVar31);
      local_8b58 = auVar44._0_2_;
      sStack_8b56 = auVar44._2_2_;
      if (w < 8) {
        if (iVar11 == 0) {
          auVar46 = packusdw(auVar77,auVar77);
          *(long *)(pCVar43 + lVar38) = auVar46._0_8_;
        }
        else {
          auVar79 = pmovzxwd(auVar58,*(undefined8 *)(pCVar43 + lVar38));
          if (iVar12 == 0) {
            iVar50 = auVar77._0_4_ + auVar79._0_4_ >> 1;
            iVar64 = auVar77._4_4_ + auVar79._4_4_ >> 1;
            iVar66 = auVar77._8_4_ + auVar79._8_4_ >> 1;
            iVar67 = auVar77._12_4_ + auVar79._12_4_ >> 1;
          }
          else {
            auVar29._4_4_ = iVar9;
            auVar29._0_4_ = iVar9;
            auVar29._8_4_ = iVar9;
            auVar29._12_4_ = iVar9;
            auVar79 = pmulld(auVar79,auVar29);
            iVar50 = auVar79._0_4_ + auVar73._0_4_ >> 4;
            iVar64 = auVar79._4_4_ + auVar73._4_4_ >> 4;
            iVar66 = auVar79._8_4_ + auVar73._8_4_ >> 4;
            iVar67 = auVar79._12_4_ + auVar73._12_4_ >> 4;
          }
          auVar60._0_4_ = iVar50 + iVar39 >> auVar46;
          auVar60._4_4_ = iVar64 + iVar39 >> auVar46;
          auVar60._8_4_ = iVar66 + iVar39 >> auVar46;
          auVar60._12_4_ = iVar67 + iVar39 >> auVar46;
          auVar46 = packusdw(auVar60,auVar60);
          sVar49 = auVar46._0_2_;
          sVar62 = auVar46._2_2_;
          sVar63 = auVar46._4_2_;
          sVar65 = auVar46._6_2_;
          *(ulong *)(dst0 + lVar38) =
               CONCAT26((ushort)(sStack_8b56 < sVar65) * sStack_8b56 |
                        (ushort)(sStack_8b56 >= sVar65) * sVar65,
                        CONCAT24((ushort)(local_8b58 < sVar63) * local_8b58 |
                                 (ushort)(local_8b58 >= sVar63) * sVar63,
                                 CONCAT22((ushort)(sStack_8b56 < sVar62) * sStack_8b56 |
                                          (ushort)(sStack_8b56 >= sVar62) * sVar62,
                                          (ushort)(local_8b58 < sVar49) * local_8b58 |
                                          (ushort)(local_8b58 >= sVar49) * sVar49)));
        }
      }
      else {
        auVar59._0_4_ = (auVar58._8_4_ + iVar37 >> auVar48) + iVar35;
        auVar59._4_4_ = (auVar81._8_4_ + iVar37 >> auVar48) + iVar35;
        auVar59._8_4_ = (auVar58._12_4_ + iVar37 >> auVar48) + iVar35;
        auVar59._12_4_ = (auVar81._12_4_ + iVar37 >> auVar48) + iVar35;
        if (iVar11 == 0) {
          auVar46 = packusdw(auVar77,auVar59);
          *(undefined1 (*) [16])(pCVar43 + lVar38) = auVar46;
        }
        else {
          auVar76 = pmovzxwd(auVar81,*(undefined8 *)(pCVar43 + lVar38));
          auVar79 = pmovzxwd(auVar28,*(undefined8 *)(pCVar43 + lVar38 + 4));
          if (iVar12 == 0) {
            iVar78 = auVar77._0_4_ + auVar76._0_4_ >> 1;
            iVar83 = auVar77._4_4_ + auVar76._4_4_ >> 1;
            iVar85 = auVar77._8_4_ + auVar76._8_4_ >> 1;
            iVar88 = auVar77._12_4_ + auVar76._12_4_ >> 1;
            iVar50 = auVar59._0_4_ + auVar79._0_4_ >> 1;
            iVar64 = auVar59._4_4_ + auVar79._4_4_ >> 1;
            iVar66 = auVar59._8_4_ + auVar79._8_4_ >> 1;
            iVar67 = auVar59._12_4_ + auVar79._12_4_ >> 1;
          }
          else {
            auVar30._4_4_ = iVar9;
            auVar30._0_4_ = iVar9;
            auVar30._8_4_ = iVar9;
            auVar30._12_4_ = iVar9;
            auVar76 = pmulld(auVar76,auVar30);
            iVar78 = auVar76._0_4_ + auVar73._0_4_ >> 4;
            iVar83 = auVar76._4_4_ + auVar73._4_4_ >> 4;
            iVar85 = auVar76._8_4_ + auVar73._8_4_ >> 4;
            iVar88 = auVar76._12_4_ + auVar73._12_4_ >> 4;
            auVar73 = pmulld(auVar79,auVar30);
            auVar79 = pmulld(auVar59,auVar45);
            iVar50 = auVar79._0_4_ + auVar73._0_4_ >> 4;
            iVar64 = auVar79._4_4_ + auVar73._4_4_ >> 4;
            iVar66 = auVar79._8_4_ + auVar73._8_4_ >> 4;
            iVar67 = auVar79._12_4_ + auVar73._12_4_ >> 4;
          }
          auVar82._0_4_ = iVar78 + iVar39 >> auVar46;
          auVar82._4_4_ = iVar83 + iVar39 >> auVar46;
          auVar82._8_4_ = iVar85 + iVar39 >> auVar46;
          auVar82._12_4_ = iVar88 + iVar39 >> auVar46;
          auVar61._0_4_ = iVar50 + iVar39 >> auVar46;
          auVar61._4_4_ = iVar64 + iVar39 >> auVar46;
          auVar61._8_4_ = iVar66 + iVar39 >> auVar46;
          auVar61._12_4_ = iVar67 + iVar39 >> auVar46;
          auVar46 = packusdw(auVar82,auVar61);
          sVar49 = auVar46._0_2_;
          sVar62 = auVar46._2_2_;
          sVar63 = auVar46._4_2_;
          sVar65 = auVar46._6_2_;
          sVar84 = auVar46._8_2_;
          sVar86 = auVar46._10_2_;
          sVar87 = auVar46._12_2_;
          sVar89 = auVar46._14_2_;
          puVar3 = dst0 + lVar38;
          *puVar3 = (ushort)(local_8b58 < sVar49) * local_8b58 |
                    (ushort)(local_8b58 >= sVar49) * sVar49;
          puVar3[1] = (ushort)(sStack_8b56 < sVar62) * sStack_8b56 |
                      (ushort)(sStack_8b56 >= sVar62) * sVar62;
          puVar3[2] = (ushort)(local_8b58 < sVar63) * local_8b58 |
                      (ushort)(local_8b58 >= sVar63) * sVar63;
          puVar3[3] = (ushort)(sStack_8b56 < sVar65) * sStack_8b56 |
                      (ushort)(sStack_8b56 >= sVar65) * sVar65;
          puVar3[4] = (ushort)(local_8b58 < sVar84) * local_8b58 |
                      (ushort)(local_8b58 >= sVar84) * sVar84;
          puVar3[5] = (ushort)(sStack_8b56 < sVar86) * sStack_8b56 |
                      (ushort)(sStack_8b56 >= sVar86) * sVar86;
          puVar3[6] = (ushort)(local_8b58 < sVar87) * local_8b58 |
                      (ushort)(local_8b58 >= sVar87) * sVar87;
          puVar3[7] = (ushort)(sStack_8b56 < sVar89) * sStack_8b56 |
                      (ushort)(sStack_8b56 >= sVar89) * sVar89;
        }
      }
    }
    pCVar43 = pCVar43 + iVar10;
    dst0 = dst0 + dst_stride0;
    puVar40 = puVar40 + 0x100;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  DECLARE_ALIGNED(16, int16_t,
                  im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = MAX_SB_SIZE;
  int i, j;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  /* Horizontal filter */
  {
    const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_x, subpel_x_qn & SUBPEL_MASK);
    const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

    for (i = 0; i < im_h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        const __m128i data2 =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j + 8]);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(data, coeff_01);
        const __m128i res_2 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 4), coeff_23);
        const __m128i res_4 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 8), coeff_45);
        const __m128i res_6 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 12), coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even =
            _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

        // Filter odd-index pixels
        const __m128i res_1 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 2), coeff_01);
        const __m128i res_3 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 6), coeff_23);
        const __m128i res_5 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 10), coeff_45);
        const __m128i res_7 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 14), coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd =
            _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        _mm_storeu_si128((__m128i *)&im_block[i * im_stride + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_y, subpel_y_qn & SUBPEL_MASK);
    const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_1) >> 1) -
        (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const int16_t *data = &im_block[i * im_stride + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);

        const __m128i res_unsigned_lo =
            _mm_add_epi32(res_lo_round, offset_const);

        if (w < 8) {
          if (do_average) {
            const __m128i data_0 =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));

            const __m128i data_ref_0 = _mm_cvtepu16_epi32(data_0);

            const __m128i comp_avg_res =
                highbd_comp_avg_sse4_1(&data_ref_0, &res_unsigned_lo, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result = highbd_convolve_rounding_sse2(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m128i res_16b =
                _mm_packus_epi32(round_result, round_result);
            const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          } else {
            const __m128i res_16b =
                _mm_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_16b);
          }
        } else {
          const __m128i res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_hi_round, offset_const);

          if (do_average) {
            const __m128i data_lo =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_hi =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j + 4]));

            const __m128i data_ref_0_lo = _mm_cvtepu16_epi32(data_lo);
            const __m128i data_ref_0_hi = _mm_cvtepu16_epi32(data_hi);

            const __m128i comp_avg_res_lo =
                highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi =
                highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_lo =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b =
                _mm_packus_epi32(round_result_lo, round_result_hi);
            const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          } else {
            const __m128i res_16b =
                _mm_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16b);
          }
        }
      }
    }
  }
}